

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

bool __thiscall cmComputeLinkInformation::Compute(cmComputeLinkInformation *this)

{
  LinkEntry *entry;
  cmGeneratorTarget *pcVar1;
  cmake *this_00;
  string *psVar2;
  bool bVar3;
  TargetType TVar4;
  Cxx20SupportLevel CVar5;
  vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *pvVar6;
  FeatureDescriptor *pFVar7;
  FeatureDescriptor *__rhs;
  string *psVar8;
  _Base_ptr p_Var9;
  ostream *poVar10;
  PolicyID id;
  LinkType lt;
  LinkEntry *pLVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string_view separator;
  string local_608;
  LinkEntry *local_5e8;
  string *local_5e0;
  string *local_5d8;
  undefined1 local_5d0 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5a8;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_5a0;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_590;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_580;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_570;
  cmValue lss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  ostringstream w;
  cmComputeLinkDepends cld;
  
  TVar4 = cmGeneratorTarget::GetType(this->Target);
  if (((((TVar4 == EXECUTABLE) ||
        (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 == SHARED_LIBRARY)) ||
       (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 == MODULE_LIBRARY)) ||
      (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 == STATIC_LIBRARY)) ||
     ((bVar3 = cmGeneratorTarget::CanCompileSources(this->Target), bVar3 &&
      ((CVar5 = cmGeneratorTarget::HaveCxxModuleSupport(this->Target,&this->Config),
       CVar5 == Supported || (bVar3 = cmGeneratorTarget::HaveFortranSources(this->Target), bVar3))))
     )) {
    if ((this->LinkLanguage)._M_string_length != 0) {
      cmComputeLinkDepends::cmComputeLinkDepends
                (&cld,this->Target,&this->Config,&this->LinkLanguage);
      cmComputeLinkDepends::SetOldLinkDirMode(&cld,this->OldLinkDirMode);
      local_5e0 = (string *)&this->LinkLanguage;
      local_5d8 = &this->Config;
      pvVar6 = cmComputeLinkDepends::Compute(&cld);
      pLVar11 = (pvVar6->
                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      __lhs = &((pvVar6->
                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                )._M_impl.super__Vector_impl_data._M_start)->Feature;
      __rhs = (FeatureDescriptor *)0x0;
      local_5e8 = pLVar11;
      do {
        entry = (LinkEntry *)(&__lhs[-3].field_2._M_allocated_capacity + 1);
        if (entry == pLVar11) {
          if ((__rhs != (FeatureDescriptor *)0x0) && ((__rhs->Suffix)._M_string_length != 0)) {
            std::__cxx11::string::string((string *)&local_558,(string *)&__rhs->Suffix);
            std::
            __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ::__shared_ptr(&local_5a0,
                           (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            *)&(this->Items).
                               super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1].Value.Backtrace);
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                      ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&w,&local_558,(cmListFileBacktrace *)&local_5a0);
            local_608._M_dataplus._M_p._0_4_ = 0;
            std::
            vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
            emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                      ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                        *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&w,(ItemIsPath *)&local_608);
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            ~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&w);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5a0._M_refcount)
            ;
            std::__cxx11::string::~string((string *)&local_558);
          }
          pcVar1 = this->Target;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&w,"LINK_SEARCH_END_STATIC",(allocator<char> *)&local_608);
          lss = cmGeneratorTarget::GetProperty(pcVar1,(string *)&w);
          std::__cxx11::string::~string((string *)&w);
          bVar3 = cmValue::IsOn(&lss);
          if (bVar3) {
            lt = LinkStatic;
          }
          else {
            lt = this->StartLinkType;
          }
          SetCurrentLinkType(this,lt);
          psVar8 = local_5d8;
          if (this->OldLinkDirMode == true) {
            for (p_Var9 = cld.OldWrongConfigItems._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_left;
                (_Rb_tree_header *)p_Var9 !=
                &cld.OldWrongConfigItems._M_t._M_impl.super__Rb_tree_header;
                p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
              pcVar1 = *(cmGeneratorTarget **)(p_Var9 + 1);
              bVar3 = cmGeneratorTarget::HasImportLibrary(pcVar1,psVar8);
              cmGeneratorTarget::GetFullPath((string *)&w,pcVar1,psVar8,(uint)bVar3,true);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &this->OldLinkDirItems,(string *)&w);
              std::__cxx11::string::~string((string *)&w);
            }
          }
          bVar3 = FinishLinkerSearchDirectories(this);
          if (bVar3) {
            AddImplicitLinkInfo(this);
            if ((this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_608,(cmPolicies *)0x3c,id);
              psVar2 = local_5e0;
              poVar10 = std::operator<<((ostream *)&w,(string *)&local_608);
              poVar10 = std::operator<<(poVar10,
                                        "\nSome library files are in directories implicitly searched by the linker when invoked for "
                                       );
              poVar10 = std::operator<<(poVar10,psVar2);
              poVar10 = std::operator<<(poVar10,":\n ");
              separator._M_str = "\n ";
              separator._M_len = 2;
              cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                        ((string *)local_5d0,&this->CMP0060WarnItems,separator);
              poVar10 = std::operator<<(poVar10,(string *)local_5d0);
              std::operator<<(poVar10,
                              "\nFor compatibility with older versions of CMake, the generated link line will ask the linker to search for these by library name."
                             );
              std::__cxx11::string::~string((string *)local_5d0);
              std::__cxx11::string::~string((string *)&local_608);
              this_00 = this->CMakeInstance;
              std::__cxx11::stringbuf::str();
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_5d0);
              cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_608,(cmListFileBacktrace *)local_5d0
                                 );
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5d0 + 8));
              std::__cxx11::string::~string((string *)&local_608);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
            }
            AddExternalObjectTargets(this);
          }
          cmComputeLinkDepends::~cmComputeLinkDepends(&cld);
          return bVar3;
        }
        if (*(int *)((long)&__lhs[-1].field_2 + 8) == 4) {
          pFVar7 = GetGroupFeature(this,__lhs);
          if (pFVar7->Supported == true) {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)entry,"</LINK_GROUP>");
            if (__rhs != (FeatureDescriptor *)0x0 && bVar3) {
              if ((__rhs->Suffix)._M_string_length == 0) {
                __rhs = (FeatureDescriptor *)0x0;
              }
              else {
                std::__cxx11::string::string((string *)&local_4d8,(string *)&__rhs->Suffix);
                std::
                __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ::__shared_ptr((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                *)(local_5d0 + 0x20),
                               (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                *)&(this->Items).
                                   super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                                   ._M_impl.super__Vector_impl_data._M_finish[-1].Value.Backtrace);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&w,&local_4d8,(cmListFileBacktrace *)(local_5d0 + 0x20));
                local_608._M_dataplus._M_p._0_4_ = 0;
                std::
                vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                ::emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                          ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                            *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&w,(ItemIsPath *)&local_608);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&w);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5a8);
                std::__cxx11::string::~string((string *)&local_4d8);
                __rhs = (FeatureDescriptor *)0x0;
                pLVar11 = local_5e8;
              }
            }
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)entry,"<LINK_GROUP>");
            std::__cxx11::string::string((string *)&local_4f8,(string *)(&pFVar7->Prefix + !bVar3));
            std::
            __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ::__shared_ptr(&local_570,
                           (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            *)((long)&__lhs[-2].field_2 + 8));
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                      ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&w,&local_4f8,(cmListFileBacktrace *)&local_570);
            local_608._M_dataplus._M_p._0_4_ = 0;
            std::
            vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
            emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                      ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                        *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&w,(ItemIsPath *)&local_608);
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            ~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&w);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_570._M_refcount)
            ;
            std::__cxx11::string::~string((string *)&local_4f8);
          }
        }
        else {
          if (__rhs == (FeatureDescriptor *)0x0) {
LAB_0036d977:
            __rhs = (FeatureDescriptor *)0x0;
          }
          else {
            bVar3 = std::operator!=(__lhs,&__rhs->Name);
            if (bVar3) {
              if ((__rhs->Suffix)._M_string_length == 0) goto LAB_0036d977;
              std::__cxx11::string::string((string *)&local_518,(string *)&__rhs->Suffix);
              std::
              __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ::__shared_ptr(&local_580,
                             (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                              *)&(this->Items).
                                 super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1].Value.Backtrace);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&w,&local_518,(cmListFileBacktrace *)&local_580);
              local_608._M_dataplus._M_p._0_4_ = 0;
              std::
              vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
              ::emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                        ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                          *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&w,(ItemIsPath *)&local_608);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              ~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&w);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_580._M_refcount);
              std::__cxx11::string::~string((string *)&local_518);
              __rhs = (FeatureDescriptor *)0x0;
              pLVar11 = local_5e8;
            }
          }
          bVar3 = std::operator!=(__lhs,(anonymous_namespace)::DEFAULT_abi_cxx11_);
          if ((bVar3) &&
             ((__rhs == (FeatureDescriptor *)0x0 ||
              (bVar3 = std::operator!=(__lhs,&__rhs->Name), bVar3)))) {
            bVar3 = AddLibraryFeature(this,__lhs);
            if (!bVar3) goto LAB_0036db12;
            __rhs = FindLibraryFeature(this,__lhs);
            if ((__rhs->Prefix)._M_string_length != 0) {
              std::__cxx11::string::string((string *)&local_538,(string *)&__rhs->Prefix);
              std::
              __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ::__shared_ptr(&local_590,
                             (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                              *)((long)&__lhs[-2].field_2 + 8));
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&w,&local_538,(cmListFileBacktrace *)&local_590);
              local_608._M_dataplus._M_p._0_4_ = 0;
              std::
              vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
              ::emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                        ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                          *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&w,(ItemIsPath *)&local_608);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              ~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&w);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_590._M_refcount);
              std::__cxx11::string::~string((string *)&local_538);
              pLVar11 = local_5e8;
            }
          }
          if (*(int *)((long)&__lhs[-1].field_2 + 8) == 2) {
            AddSharedDepItem(this,entry);
          }
          else {
            AddItem(this,entry);
          }
        }
LAB_0036db12:
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &__lhs[3]._M_string_length;
      } while( true );
    }
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cld,
                   "CMake can not determine linker language for target: ",psVar8);
    cmSystemTools::Error((string *)&cld);
    std::__cxx11::string::~string((string *)&cld);
  }
  return false;
}

Assistant:

bool cmComputeLinkInformation::Compute()
{
  // Skip targets that do not link or have link-like information consumers may
  // need (namely modules).
  if (!(this->Target->GetType() == cmStateEnums::EXECUTABLE ||
        this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
        (this->Target->CanCompileSources() &&
         (this->Target->HaveCxxModuleSupport(this->Config) ==
            cmGeneratorTarget::Cxx20SupportLevel::Supported ||
          this->Target->HaveFortranSources())))) {
    return false;
  }

  // We require a link language for the target.
  if (this->LinkLanguage.empty()) {
    cmSystemTools::Error(
      "CMake can not determine linker language for target: " +
      this->Target->GetName());
    return false;
  }

  // Compute the ordered link line items.
  cmComputeLinkDepends cld(this->Target, this->Config, this->LinkLanguage);
  cld.SetOldLinkDirMode(this->OldLinkDirMode);
  cmComputeLinkDepends::EntryVector const& linkEntries = cld.Compute();
  FeatureDescriptor const* currentFeature = nullptr;

  // Add the link line items.
  for (cmComputeLinkDepends::LinkEntry const& linkEntry : linkEntries) {
    if (linkEntry.Kind == cmComputeLinkDepends::LinkEntry::Group) {
      const auto& groupFeature = this->GetGroupFeature(linkEntry.Feature);
      if (groupFeature.Supported) {
        if (linkEntry.Item.Value == "</LINK_GROUP>" &&
            currentFeature != nullptr) {
          // emit feature suffix, if any
          if (!currentFeature->Suffix.empty()) {
            this->Items.emplace_back(
              BT<std::string>{ currentFeature->Suffix,
                               this->Items.back().Value.Backtrace },
              ItemIsPath::No);
          }
          currentFeature = nullptr;
        }
        this->Items.emplace_back(
          BT<std::string>{ linkEntry.Item.Value == "<LINK_GROUP>"
                             ? groupFeature.Prefix
                             : groupFeature.Suffix,
                           linkEntry.Item.Backtrace },
          ItemIsPath::No);
      }
      continue;
    }

    if (currentFeature != nullptr &&
        linkEntry.Feature != currentFeature->Name) {
      // emit feature suffix, if any
      if (!currentFeature->Suffix.empty()) {
        this->Items.emplace_back(
          BT<std::string>{ currentFeature->Suffix,
                           this->Items.back().Value.Backtrace },
          ItemIsPath::No);
      }
      currentFeature = nullptr;
    }

    if (linkEntry.Feature != DEFAULT &&
        (currentFeature == nullptr ||
         linkEntry.Feature != currentFeature->Name)) {
      if (!this->AddLibraryFeature(linkEntry.Feature)) {
        continue;
      }
      currentFeature = this->FindLibraryFeature(linkEntry.Feature);
      // emit feature prefix, if any
      if (!currentFeature->Prefix.empty()) {
        this->Items.emplace_back(
          BT<std::string>{ currentFeature->Prefix, linkEntry.Item.Backtrace },
          ItemIsPath::No);
      }
    }

    if (linkEntry.Kind == cmComputeLinkDepends::LinkEntry::SharedDep) {
      this->AddSharedDepItem(linkEntry);
    } else {
      this->AddItem(linkEntry);
    }
  }

  if (currentFeature != nullptr) {
    // emit feature suffix, if any
    if (!currentFeature->Suffix.empty()) {
      this->Items.emplace_back(
        BT<std::string>{ currentFeature->Suffix,
                         this->Items.back().Value.Backtrace },
        ItemIsPath::No);
    }
  }

  // Restore the target link type so the correct system runtime
  // libraries are found.
  cmValue lss = this->Target->GetProperty("LINK_SEARCH_END_STATIC");
  if (lss.IsOn()) {
    this->SetCurrentLinkType(LinkStatic);
  } else {
    this->SetCurrentLinkType(this->StartLinkType);
  }

  // Finish listing compatibility paths.
  if (this->OldLinkDirMode) {
    // For CMake 2.4 bug-compatibility we need to consider the output
    // directories of targets linked in another configuration as link
    // directories.
    std::set<cmGeneratorTarget const*> const& wrongItems =
      cld.GetOldWrongConfigItems();
    for (cmGeneratorTarget const* tgt : wrongItems) {
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(this->Config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      this->OldLinkDirItems.push_back(
        tgt->GetFullPath(this->Config, artifact, true));
    }
  }

  // Finish setting up linker search directories.
  if (!this->FinishLinkerSearchDirectories()) {
    return false;
  }

  // Add implicit language runtime libraries and directories.
  this->AddImplicitLinkInfo();

  if (!this->CMP0060WarnItems.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0060) << "\n"
      "Some library files are in directories implicitly searched by "
      "the linker when invoked for " << this->LinkLanguage << ":\n"
      " " << cmJoin(this->CMP0060WarnItems, "\n ") << "\n"
      "For compatibility with older versions of CMake, the generated "
      "link line will ask the linker to search for these by library "
      "name."
      ;
    /* clang-format on */
    this->CMakeInstance->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                                      this->Target->GetBacktrace());
  }

  // Record targets referenced by $<TARGET_OBJECTS:...> sources.
  this->AddExternalObjectTargets();

  return true;
}